

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::markNeedsFlush(QWidgetRepaintManager *this,QWidget *widget,QRegion *region)

{
  bool bVar1;
  QWidgetPrivate *pQVar2;
  QRegion *this_00;
  long in_FS_OFFSET;
  QWidget *widget_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  widget_local = widget;
  if (widget != (QWidget *)0x0) {
    pQVar2 = qt_widget_private(widget);
    this_00 = pQVar2->needsFlush;
    if (this_00 == (QRegion *)0x0) {
      this_00 = (QRegion *)operator_new(8);
      QRegion::QRegion(this_00);
      pQVar2->needsFlush = this_00;
    }
    QRegion::operator+=(this_00,region);
    bVar1 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                      ((QListSpecialMethodsBase<QWidget*> *)(this + 0x50),&widget_local);
    if (!bVar1) {
      QList<QWidget_*>::append((QList<QWidget_*> *)(this + 0x50),widget_local);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region)
{
    if (!widget)
        return;

    auto *widgetPrivate = qt_widget_private(widget);
    if (!widgetPrivate->needsFlush)
        widgetPrivate->needsFlush = new QRegion;

    *widgetPrivate->needsFlush += region;

    if (!needsFlushWidgets.contains(widget))
        needsFlushWidgets.append(widget);
}